

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson.c
# Opt level: O0

_Bool bson_validate(bson_t *bson,bson_validate_flags_t flags,size_t *offset)

{
  bson_validate_state_t state;
  size_t *offset_local;
  bson_validate_flags_t flags_local;
  bson_t *bson_local;
  
  _bson_validate_internal
            ((bson_t *)state.error.message._56_8_,
             (bson_validate_state_t *)state.error.message._48_8_);
  if ((0 < (long)state._0_8_) && (offset != (size_t *)0x0)) {
    *offset = state._0_8_;
  }
  return (long)state._0_8_ < 0;
}

Assistant:

bool
bson_validate (const bson_t *bson, bson_validate_flags_t flags, size_t *offset)
{
   bson_validate_state_t state;

   state.flags = flags;
   _bson_validate_internal (bson, &state);

   if (state.err_offset > 0 && offset) {
      *offset = (size_t) state.err_offset;
   }

   return state.err_offset < 0;
}